

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O0

void dgrminer::fail_with_message(string *message,int line_number)

{
  __cxx11 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [36];
  int local_14;
  string *psStack_10;
  int line_number_local;
  string *message_local;
  
  local_14 = line_number;
  psStack_10 = message;
  std::operator+(local_78,(char *)message);
  std::__cxx11::to_string(local_98,local_14);
  std::operator+(local_58,local_78);
  std::operator+(local_38,(char *)local_58);
  fail_with_message(local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void fail_with_message(std::string message, int line_number)
    {
        fail_with_message(message + " (LINE " + std::to_string(line_number) + ")");
    }